

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O3

void burstsortL(uchar **strings,size_t scnt)

{
  byte bVar1;
  byte *pbVar2;
  trierec *ptVar3;
  uint uVar4;
  void *__ptr;
  long lVar5;
  TRIE *node;
  trierec *ptVar6;
  uint uVar7;
  ulong uVar8;
  trierec *ptVar9;
  trierec *ptVar10;
  ulong uVar11;
  ulong uVar12;
  
  __ptr = calloc(scnt,0x10);
  if ((int)scnt != 0) {
    lVar5 = (scnt & 0xffffffff) << 3;
    do {
      *(undefined8 *)((long)__ptr + lVar5 * 2 + -0x10) = *(undefined8 *)((long)strings + lVar5 + -8)
      ;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  node = (TRIE *)calloc(1,0xc00);
  if (scnt != 0) {
    uVar11 = 0;
    do {
      pbVar2 = *(byte **)((long)__ptr + uVar11 * 0x10);
      uVar8 = (ulong)*pbVar2;
      uVar4 = node->counts[uVar8];
      ptVar10 = node;
      if ((int)uVar4 < 0) {
        uVar12 = 1;
        do {
          ptVar10 = ptVar10->ptrs[uVar8];
          uVar8 = (ulong)pbVar2[uVar12];
          uVar4 = ptVar10->counts[uVar8];
          uVar7 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar7;
        } while ((int)uVar4 < 0);
        uVar12 = (ulong)uVar7;
      }
      else {
        uVar12 = 1;
      }
      ptVar9 = (trierec *)(uVar11 * 0x10 + (long)__ptr);
      ptVar9->ptrs[1] = ptVar10->ptrs[uVar8];
      ptVar10->ptrs[uVar8] = ptVar9;
      if (((char)uVar8 != '\0') && (ptVar10->counts[uVar8] = uVar4 + 1, 0x1fff < uVar4)) {
        ptVar10->counts[uVar8] = -1;
        ptVar6 = (trierec *)calloc(1,0xc00);
        do {
          ptVar3 = ptVar9->ptrs[1];
          bVar1 = *(byte *)((long)ptVar9->ptrs[0]->ptrs + uVar12);
          ptVar9->ptrs[1] = ptVar6->ptrs[bVar1];
          ptVar6->ptrs[bVar1] = ptVar9;
          ptVar6->counts[bVar1] = ptVar6->counts[bVar1] + 1;
          ptVar9 = ptVar3;
        } while (ptVar3 != (trierec *)0x0);
        ptVar10->ptrs[uVar8] = ptVar6;
        ptVar10->counts[uVar8] = -1;
      }
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (uVar11 < scnt);
  }
  bursttraverseL(node,strings,0,0);
  free(__ptr);
  return;
}

Assistant:

void
burstsortL(unsigned char *strings[], size_t scnt)
{
    TRIE	*root;
    LIST	*listnodes;
    unsigned int i;

    listnodes = (LIST *) calloc(scnt, sizeof(LIST));

    for( i=scnt; i-- ;)
        listnodes[i].word = strings[i];

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertL(root, listnodes, scnt);

    (void) bursttraverseL(root, strings, 0, 0);

    free(listnodes);

    return;
}